

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O0

bool __thiscall draco::CornerTable::IsDegenerated(CornerTable *this,FaceIndex face)

{
  bool bVar1;
  CornerIndex CVar2;
  uint in_ESI;
  FaceIndex in_EDI;
  VertexIndex v2;
  VertexIndex v1;
  VertexIndex v0;
  CornerIndex first_face_corner;
  CornerTable *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffcc;
  CornerIndex in_stack_ffffffffffffffd0;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_24;
  uint local_20;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_1c;
  uint local_18;
  uint local_14;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_8 [2];
  
  local_8[0].value_ = in_ESI;
  bVar1 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator==
                    (local_8,(IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *)
                             &kInvalidFaceIndex);
  if (!bVar1) {
    local_18 = local_8[0].value_;
    local_20 = (uint)FirstCorner(in_stack_ffffffffffffffb8,in_EDI);
    local_14 = local_20;
    local_1c.value_ =
         (uint)Vertex((CornerTable *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffd0);
    Next((CornerTable *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
         in_stack_ffffffffffffffd0);
    local_24.value_ =
         (uint)Vertex((CornerTable *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffd0);
    uVar3 = local_14;
    CVar2 = Previous((CornerTable *)CONCAT44(in_stack_ffffffffffffffcc,local_14),
                     in_stack_ffffffffffffffd0);
    Vertex((CornerTable *)CONCAT44(CVar2.value_,uVar3),in_stack_ffffffffffffffd0);
    bVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator==(&local_1c,&local_24);
    if (((!bVar1) &&
        (bVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator==
                           (&local_1c,
                            (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                            &stack0xffffffffffffffd0), !bVar1)) &&
       (bVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator==
                          (&local_24,
                           (IndexType<unsigned_int,_draco::VertexIndex_tag_type_> *)
                           &stack0xffffffffffffffd0), !bVar1)) {
      return false;
    }
  }
  return true;
}

Assistant:

bool CornerTable::IsDegenerated(FaceIndex face) const {
  if (face == kInvalidFaceIndex) {
    return true;
  }
  const CornerIndex first_face_corner = FirstCorner(face);
  const VertexIndex v0 = Vertex(first_face_corner);
  const VertexIndex v1 = Vertex(Next(first_face_corner));
  const VertexIndex v2 = Vertex(Previous(first_face_corner));
  if (v0 == v1 || v0 == v2 || v1 == v2) {
    return true;
  }
  return false;
}